

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

int Rnm_ManSensitize(Rnm_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  Rnm_Obj_t *pRVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  bool bVar11;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  Abc_Cex_t *pAVar15;
  int iVar16;
  int iVar17;
  Rnm_Obj_t RVar18;
  Rnm_Obj_t RVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int local_5c;
  
  pAVar15 = p->pCex;
  iVar16 = pAVar15->iFrame;
  local_5c = pAVar15->nRegs;
  if (-1 < iVar16) {
    iVar17 = 0;
    do {
      pVVar12 = p->vMap;
      if (0 < pVVar12->nSize) {
        lVar22 = 0;
        do {
          iVar16 = pVVar12->pArray[lVar22];
          if (((long)iVar16 < 0) || (p->pGia->nObjs <= iVar16)) goto LAB_00572a34;
          pGVar7 = p->pGia->pObjs;
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          pGVar7 = pGVar7 + iVar16;
          uVar23 = (uint)*(ulong *)pGVar7;
          if (((uVar23 & 0x9fffffff) != 0x9fffffff) &&
             (((int)uVar23 < 0 || ((uVar23 & 0x1fffffff) == 0x1fffffff)))) {
            __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x196,"int Rnm_ManSensitize(Rnm_Man_t *)");
          }
          if (((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) && (pGVar7->Value == 0))
          goto LAB_00572a91;
          uVar23 = pGVar7->Value;
          if (p->nObjsFrame <= (int)uVar23) goto LAB_00572a53;
          if (p->pCex->iFrame < iVar17) goto LAB_00572a72;
          iVar16 = p->nObjsFrame * iVar17;
          pRVar8 = p->pObjs;
          uVar20 = local_5c + (int)lVar22;
          RVar19 = pRVar8[(long)iVar16 + (ulong)uVar23];
          uVar20 = (uint)(((uint)(&p->pCex[1].iPo)[(int)uVar20 >> 5] >> (uVar20 & 0x1f) & 1) != 0);
          pRVar8[(long)iVar16 + (ulong)uVar23] = (Rnm_Obj_t)((uint)RVar19 & 0xfffffffe | uVar20);
          if ((((uint)*(ulong *)pGVar7 & 0x9fffffff) != 0x9fffffff) ||
             (p->pGia->vCis->nSize - p->pGia->nRegs <=
              (int)((uint)(*(ulong *)pGVar7 >> 0x20) & 0x1fffffff))) {
            if (pGVar7->Value == 0) {
              __assert_fail("pObj->Value > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                            ,0x19b,"int Rnm_ManSensitize(Rnm_Man_t *)");
            }
            pRVar8[(long)iVar16 + (ulong)uVar23] =
                 (Rnm_Obj_t)
                 ((pGVar7->Value & 0xffffff) * 0x10 + ((uint)RVar19 & 0xf0000006 | uVar20) + 8);
          }
          lVar22 = lVar22 + 1;
          pVVar12 = p->vMap;
        } while (lVar22 < pVVar12->nSize);
      }
      pVVar12 = p->vObjs;
      if (0 < pVVar12->nSize) {
        lVar22 = 0;
        do {
          iVar16 = pVVar12->pArray[lVar22];
          if ((long)iVar16 < 0) goto LAB_00572a34;
          pGVar9 = p->pGia;
          if (pGVar9->nObjs <= iVar16) goto LAB_00572a34;
          pGVar7 = pGVar9->pObjs;
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar7 + iVar16;
          uVar10 = *(ulong *)pGVar1;
          uVar20 = (uint)uVar10;
          uVar23 = (uint)(uVar10 >> 0x20);
          if ((uVar20 & 0x9fffffff) == 0x9fffffff) {
            if ((int)(uVar23 & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs) {
LAB_00572ab0:
              __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                            ,0x1a2,"int Rnm_ManSensitize(Rnm_Man_t *)");
            }
          }
          else if ((~uVar20 & 0x1fffffff) == 0) goto LAB_00572ab0;
          if (((~uVar10 & 0x1fffffff1fffffff) != 0) && (pGVar1->Value == 0)) goto LAB_00572a91;
          uVar2 = pGVar1->Value;
          iVar16 = p->nObjsFrame;
          if (iVar16 <= (int)uVar2) goto LAB_00572a53;
          iVar3 = p->pCex->iFrame;
          if (iVar3 < iVar17) goto LAB_00572a72;
          pRVar8 = p->pObjs;
          iVar21 = iVar16 * iVar17;
          RVar19 = pRVar8[(long)iVar21 + (ulong)uVar2];
          if (((uint)RVar19 & 8) != 0) {
            __assert_fail("!pRnm->fPPi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x1a4,"int Rnm_ManSensitize(Rnm_Man_t *)");
          }
          if (((uVar20 & 0x9fffffff) == 0x9fffffff) &&
             (pGVar9->vCis->nSize - pGVar9->nRegs <= (int)(uVar23 & 0x1fffffff))) {
            if (iVar17 != 0) {
              iVar5 = pGVar9->vCis->nSize;
              if ((int)(uVar23 & 0x1fffffff) < iVar5 - pGVar9->nRegs) {
                __assert_fail("Gia_ObjIsRo(p, pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
              }
              iVar6 = pGVar9->vCos->nSize;
              uVar23 = (iVar6 - iVar5) + (uVar23 & 0x1fffffff);
              if ((-1 < (int)uVar23) && ((int)uVar23 < iVar6)) {
                iVar5 = pGVar9->vCos->pArray[uVar23];
                if ((-1 < (long)iVar5) && (iVar5 < pGVar9->nObjs)) {
                  pGVar7 = pGVar7 + iVar5;
                  if (((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) == 0) || (pGVar7->Value != 0)) {
                    uVar23 = pGVar7->Value;
                    if ((int)uVar23 < iVar16) {
                      if (iVar17 + -1 <= iVar3) {
                        iVar16 = iVar16 * (iVar17 + -1);
                        RVar18 = (Rnm_Obj_t)
                                 ((uint)RVar19 & 0xfffffff6 |
                                 (uint)pRVar8[(long)iVar16 + (ulong)uVar23] & 1);
                        pRVar8[(long)iVar21 + (ulong)uVar2] = RVar18;
                        RVar19 = pRVar8[(long)iVar16 + (ulong)uVar23];
LAB_005728c8:
                        RVar19 = (Rnm_Obj_t)((uint)RVar18 & 0xf0000007 | (uint)RVar19 & 0xffffff0);
                        goto LAB_0057294a;
                      }
                      goto LAB_00572a72;
                    }
                    goto LAB_00572a53;
                  }
                  goto LAB_00572a91;
                }
                goto LAB_00572a34;
              }
              goto LAB_00572b6a;
            }
          }
          else {
            uVar13 = uVar10 & 0x1fffffff;
            if (uVar13 != 0x1fffffff && (int)uVar20 < 0) {
              pGVar1 = pGVar1 + -uVar13;
              if (((~*(ulong *)pGVar1 & 0x1fffffff1fffffff) == 0) || (pGVar1->Value != 0)) {
                uVar23 = pGVar1->Value;
                if ((int)uVar23 < iVar16) {
                  RVar18 = (Rnm_Obj_t)
                           ((uint)RVar19 & 0xfffffff6 |
                           (uVar20 >> 0x1d ^ (uint)pRVar8[(long)iVar21 + (ulong)uVar23]) & 1);
                  pRVar8[(long)iVar21 + (ulong)uVar2] = RVar18;
                  RVar19 = pRVar8[(long)iVar21 + (ulong)uVar23];
                  goto LAB_005728c8;
                }
                goto LAB_00572a53;
              }
              goto LAB_00572a91;
            }
            if (((int)uVar20 < 0) || ((int)uVar13 == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                            ,0x1b5,"int Rnm_ManSensitize(Rnm_Man_t *)");
            }
            pGVar7 = pGVar1 + -uVar13;
            if (((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) && (pGVar7->Value == 0))
            goto LAB_00572a91;
            uVar20 = pGVar7->Value;
            if (iVar16 <= (int)uVar20) goto LAB_00572a53;
            pGVar7 = pGVar1 + -(ulong)(uVar23 & 0x1fffffff);
            if (((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) && (pGVar7->Value == 0))
            goto LAB_00572a91;
            uVar4 = pGVar7->Value;
            if (iVar16 <= (int)uVar4) goto LAB_00572a53;
            uVar23 = (uVar23 >> 0x1d ^ (uint)pRVar8[(long)iVar21 + (ulong)uVar4]) &
                     ((uint)(uVar10 >> 0x1d) & 7 ^ (uint)pRVar8[(long)iVar21 + (ulong)uVar20]) & 1;
            pRVar8[(long)iVar21 + (ulong)uVar2] = (Rnm_Obj_t)((uint)RVar19 & 0xfffffff6 | uVar23);
            RVar18 = pRVar8[(long)iVar21 + (ulong)uVar20];
            if (uVar23 == 0) {
              uVar23 = (uint)(*(ulong *)pGVar1 >> 0x1d) & 7 ^ (uint)RVar18;
              if ((uVar23 & 1) == 0) {
                if ((((uint)(*(ulong *)pGVar1 >> 0x3d) ^ (uint)pRVar8[(long)iVar21 + (ulong)uVar4])
                    & 1) == 0) {
                  uVar20 = (uint)RVar18 >> 4 & 0xffffff;
                  uVar23 = (uint)pRVar8[(long)iVar21 + (ulong)uVar4] >> 4 & 0xffffff;
                  if (uVar20 < uVar23) {
                    uVar23 = uVar20;
                  }
                  RVar19 = (Rnm_Obj_t)((uint)RVar19 & 0xf0000006 | uVar23 << 4);
                }
                else {
                  if ((uVar23 & 1) != 0) goto LAB_00572932;
                  RVar19 = (Rnm_Obj_t)((uint)RVar19 & 0xf0000006 | (uint)RVar18 & 0xffffff0);
                }
              }
              else {
LAB_00572932:
                RVar19 = (Rnm_Obj_t)
                         ((uint)RVar19 & 0xf0000006 |
                         (uint)pRVar8[(long)iVar21 + (ulong)uVar4] & 0xffffff0);
              }
            }
            else {
              uVar14 = (uint)RVar18 >> 4 & 0xffffff;
              uVar20 = (uint)pRVar8[(long)iVar21 + (ulong)uVar4] >> 4 & 0xffffff;
              if (uVar20 < uVar14) {
                uVar20 = uVar14;
              }
              RVar19 = (Rnm_Obj_t)((uint)RVar19 & 0xf0000006 | uVar23 | uVar20 << 4);
            }
LAB_0057294a:
            pRVar8[(long)iVar21 + (ulong)uVar2] = RVar19;
          }
          lVar22 = lVar22 + 1;
          pVVar12 = p->vObjs;
        } while (lVar22 < pVVar12->nSize);
      }
      pAVar15 = p->pCex;
      local_5c = local_5c + pAVar15->nPis;
      iVar16 = pAVar15->iFrame;
      bVar11 = iVar17 < iVar16;
      iVar17 = iVar17 + 1;
    } while (bVar11);
  }
  if (local_5c != pAVar15->nBits) {
    __assert_fail("iBit == p->pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                  ,0x1c3,"int Rnm_ManSensitize(Rnm_Man_t *)");
  }
  pGVar9 = p->pGia;
  iVar17 = pGVar9->vCos->nSize;
  if (iVar17 <= pGVar9->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar17 < 1) {
LAB_00572b6a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar17 = *pGVar9->vCos->pArray;
  if ((-1 < (long)iVar17) && (iVar17 < pGVar9->nObjs)) {
    pGVar7 = pGVar9->pObjs + iVar17;
    if (((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) == 0) || (pGVar7->Value != 0)) {
      uVar23 = pGVar7->Value;
      if ((int)uVar23 < p->nObjsFrame) {
        if (-1 < iVar16) {
          iVar16 = p->nObjsFrame * iVar16;
          pRVar8 = p->pObjs;
          if (((uint)pRVar8[(long)iVar16 + (ulong)uVar23] & 1) == 0) {
            puts("Output value is incorrect.");
          }
          return (uint)pRVar8[(long)iVar16 + (ulong)uVar23] >> 4 & 0xffffff;
        }
LAB_00572a72:
        __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                      ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
      }
LAB_00572a53:
      __assert_fail("(int)pObj->Value < p->nObjsFrame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                    ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
    }
LAB_00572a91:
    __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                  ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  }
LAB_00572a34:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Rnm_ManSensitize( Rnm_Man_t * p )
{
    Rnm_Obj_t * pRnm, * pRnm0, * pRnm1;
    Gia_Obj_t * pObj;
    int f, i, iBit = p->pCex->nRegs;
    // const0 is initialized automatically in all timeframes
    for ( f = 0; f <= p->pCex->iFrame; f++, iBit += p->pCex->nPis )
    {
        Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            pRnm->Value = Abc_InfoHasBit( p->pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p->pGia, pObj) ) // this is PPI
            {
                assert( pObj->Value > 0 );
                pRnm->Prio = pObj->Value;
                pRnm->fPPi = 1;
            }
        }
        Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            assert( !pRnm->fPPi );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                    continue;
                pRnm0 = Rnm_ManObj( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                pRnm->Value = pRnm0->Value;
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            if ( Gia_ObjIsCo(pObj) )
            {
                pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
                pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj));
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
            pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
            pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) & (pRnm1->Value ^ Gia_ObjFaninC1(pObj));
            if ( pRnm->Value == 1 )
                pRnm->Prio  = Abc_MaxInt( pRnm0->Prio, pRnm1->Prio );
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRnm->Prio  = Abc_MinInt( pRnm0->Prio, pRnm1->Prio ); // choice
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRnm->Prio  = pRnm0->Prio;
            else 
                pRnm->Prio  = pRnm1->Prio;
        }
    }
    assert( iBit == p->pCex->nBits );
    pRnm = Rnm_ManObj( p, Gia_ManPo(p->pGia, 0), p->pCex->iFrame );
    if ( pRnm->Value != 1 )
        printf( "Output value is incorrect.\n" );
    return pRnm->Prio;
}